

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O1

void __thiscall dg::vr::GraphBuilder::buildTerminators(GraphBuilder *this,Function *function)

{
  BranchInst BVar1;
  VRLocation *last;
  int iVar2;
  mapped_type *ppVVar3;
  BranchInst *inst;
  sockaddr *__addr;
  Function *pFVar4;
  Function *local_38;
  
  pFVar4 = *(Function **)(function + 0x50);
  if (pFVar4 != function + 0x48) {
    do {
      local_38 = pFVar4 + -0x18;
      if (pFVar4 == (Function *)0x0) {
        local_38 = (Function *)0x0;
      }
      ppVVar3 = std::
                map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                ::operator[]((map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                              *)(this + 0x40),(key_type *)&local_38);
      last = *ppVVar3;
      inst = (BranchInst *)llvm::BasicBlock::getTerminator();
      BVar1 = inst[0x10];
      if (inst == (BranchInst *)0x0 || BVar1 != (BranchInst)0x1d) {
        if (inst == (BranchInst *)0x0 || BVar1 != (BranchInst)0x1e) {
          if (inst == (BranchInst *)0x0 || BVar1 != (BranchInst)0x1c) {
            if (inst != (BranchInst *)0x0) {
              iVar2 = llvm::Instruction::getNumSuccessors();
              if (iVar2 != 0) {
                abort();
              }
            }
          }
          else {
            __addr = (sockaddr *)operator_new(0x18);
            __addr->sa_data[6] = '\x01';
            __addr->sa_data[7] = '\0';
            __addr->sa_data[8] = '\0';
            __addr->sa_data[9] = '\0';
            *(undefined ***)__addr = &PTR__VROp_00136d60;
            *(BranchInst **)(__addr + 1) = inst;
            VRLocation::connect(last,0,__addr,0x136d60);
          }
        }
        else {
          buildSwitch(this,(SwitchInst *)inst,last);
        }
      }
      else {
        buildBranch(this,inst,last);
      }
      pFVar4 = *(Function **)(pFVar4 + 8);
    } while (pFVar4 != function + 0x48);
  }
  return;
}

Assistant:

void GraphBuilder::buildTerminators(const llvm::Function &function) {
    for (const llvm::BasicBlock &block : function) {
        assert(backs.find(&block) != backs.end());
        VRLocation &last = *backs[&block];

        const llvm::Instruction *terminator = block.getTerminator();
        if (const auto *branch = llvm::dyn_cast<llvm::BranchInst>(terminator)) {
            buildBranch(branch, last);

        } else if (const auto *swtch =
                           llvm::dyn_cast<llvm::SwitchInst>(terminator)) {
            buildSwitch(swtch, last);

        } else if (const auto *rturn =
                           llvm::dyn_cast<llvm::ReturnInst>(terminator)) {
            buildReturn(rturn, last);

        } else if (llvm::succ_begin(&block) != llvm::succ_end(&block)) {
#ifndef NDEBUG
            std::cerr << "Unhandled  terminator: "
                      << dg::debug::getValName(terminator) << "\n";
            llvm::errs() << "Unhandled terminator: " << *terminator << "\n";
#endif
            abort();
        }
    }
}